

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-hash.c
# Opt level: O3

void * Curl_uint_hash_get(uint_hash *h,uint id)

{
  uint_hash_entry *puVar1;
  void *pvVar2;
  
  pvVar2 = (void *)0x0;
  if (h->table != (uint_hash_entry **)0x0) {
    puVar1 = (uint_hash_entry *)(h->table + (ulong)id % (ulong)h->slots);
    do {
      puVar1 = puVar1->next;
      if (puVar1 == (uint_hash_entry *)0x0) {
        return (void *)0x0;
      }
    } while (puVar1->id != id);
    pvVar2 = puVar1->value;
  }
  return pvVar2;
}

Assistant:

void *Curl_uint_hash_get(struct uint_hash *h, unsigned int id)
{
  DEBUGASSERT(h);
  DEBUGASSERT(h->init == CURL_UINTHASHINIT);
  if(h->table) {
    struct uint_hash_entry *he;
    DEBUGASSERT(h->slots);
    he = CURL_UINT_HASH_SLOT(h, id);
    while(he) {
      if(id == he->id) {
        return he->value;
      }
      he = he->next;
    }
  }
  return NULL;
}